

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::MemberSorter::sort(MemberSorter *this)

{
  Meta *pMVar1;
  SPIRType *pSVar2;
  bool bVar3;
  uint *puVar4;
  uint *puVar5;
  size_t sVar6;
  size_t sVar7;
  TypedID<(spirv_cross::Types)1> *pTVar8;
  TypedID<(spirv_cross::Types)1> *pTVar9;
  Decoration *pDVar10;
  Decoration *this_00;
  uint local_e8;
  uint local_e4;
  uint32_t map_idx;
  uint32_t mbr_idx_1;
  Vector<Decoration> mbr_meta_cpy;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> mbr_types_cpy;
  uint local_80;
  uint32_t mbr_idx;
  bool sort_is_identity;
  undefined1 local_50 [8];
  SmallVector<unsigned_int,_8UL> mbr_idxs;
  size_t mbr_cnt;
  MemberSorter *this_local;
  
  mbr_idxs.stack_storage.aligned_char._24_8_ =
       VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                 (&(this->type->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  SmallVector<unsigned_int,_8UL>::SmallVector
            ((SmallVector<unsigned_int,_8UL> *)local_50,mbr_idxs.stack_storage.aligned_char._24_8_);
  puVar4 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)local_50);
  puVar5 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)local_50);
  ::std::iota<unsigned_int*,int>(puVar4,puVar5,0);
  puVar4 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)local_50);
  puVar5 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)local_50);
  ::std::stable_sort<unsigned_int*,spirv_cross::CompilerMSL::MemberSorter>(puVar4,puVar5,*this);
  bVar3 = true;
  local_80 = 0;
  do {
    if ((ulong)mbr_idxs.stack_storage.aligned_char._24_8_ <= (ulong)local_80) {
LAB_0048415b:
      if (!bVar3) {
        sVar6 = VectorView<spirv_cross::Meta::Decoration>::size
                          (&(this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>);
        sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(this->type->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        if (sVar6 < sVar7) {
          pMVar1 = this->meta;
          sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(this->type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
          SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(&pMVar1->members,sVar6);
        }
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::SmallVector
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   &mbr_meta_cpy.field_0x18,&this->type->member_types);
        SmallVector<spirv_cross::Meta::Decoration,_0UL>::SmallVector
                  ((SmallVector<spirv_cross::Meta::Decoration,_0UL> *)&map_idx,&this->meta->members)
        ;
        for (local_e4 = 0; (ulong)local_e4 < (ulong)mbr_idxs.stack_storage.aligned_char._24_8_;
            local_e4 = local_e4 + 1) {
          puVar4 = VectorView<unsigned_int>::operator[]
                             ((VectorView<unsigned_int> *)local_50,(ulong)local_e4);
          pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                             ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                              &mbr_meta_cpy.field_0x18,(ulong)*puVar4);
          pTVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                             (&(this->type->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                              (ulong)local_e4);
          pTVar9->id = pTVar8->id;
          puVar4 = VectorView<unsigned_int>::operator[]
                             ((VectorView<unsigned_int> *)local_50,(ulong)local_e4);
          pDVar10 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                              ((VectorView<spirv_cross::Meta::Decoration> *)&map_idx,(ulong)*puVar4)
          ;
          this_00 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                              (&(this->meta->members).
                                super_VectorView<spirv_cross::Meta::Decoration>,(ulong)local_e4);
          Meta::Decoration::operator=(this_00,pDVar10);
        }
        if (this->sort_aspect == Offset) {
          SmallVector<unsigned_int,_8UL>::resize
                    (&this->type->member_type_index_redirection,
                     mbr_idxs.stack_storage.aligned_char._24_8_);
          for (local_e8 = 0; (ulong)local_e8 < (ulong)mbr_idxs.stack_storage.aligned_char._24_8_;
              local_e8 = local_e8 + 1) {
            pSVar2 = this->type;
            puVar4 = VectorView<unsigned_int>::operator[]
                               ((VectorView<unsigned_int> *)local_50,(ulong)local_e8);
            puVar4 = VectorView<unsigned_int>::operator[]
                               (&(pSVar2->member_type_index_redirection).
                                 super_VectorView<unsigned_int>,(ulong)*puVar4);
            *puVar4 = local_e8;
          }
        }
        SmallVector<spirv_cross::Meta::Decoration,_0UL>::~SmallVector
                  ((SmallVector<spirv_cross::Meta::Decoration,_0UL> *)&map_idx);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::~SmallVector
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   &mbr_meta_cpy.field_0x18);
      }
      SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_50);
      return;
    }
    puVar4 = VectorView<unsigned_int>::operator[]
                       ((VectorView<unsigned_int> *)local_50,(ulong)local_80);
    if (local_80 != *puVar4) {
      bVar3 = false;
      goto LAB_0048415b;
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::MemberSorter::sort()
{
	// Create a temporary array of consecutive member indices and sort it based on how
	// the members should be reordered, based on builtin and sorting aspect meta info.
	size_t mbr_cnt = type.member_types.size();
	SmallVector<uint32_t> mbr_idxs(mbr_cnt);
	std::iota(mbr_idxs.begin(), mbr_idxs.end(), 0); // Fill with consecutive indices
	std::stable_sort(mbr_idxs.begin(), mbr_idxs.end(), *this); // Sort member indices based on sorting aspect

	bool sort_is_identity = true;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		if (mbr_idx != mbr_idxs[mbr_idx])
		{
			sort_is_identity = false;
			break;
		}
	}

	if (sort_is_identity)
		return;

	if (meta.members.size() < type.member_types.size())
	{
		// This should never trigger in normal circumstances, but to be safe.
		meta.members.resize(type.member_types.size());
	}

	// Move type and meta member info to the order defined by the sorted member indices.
	// This is done by creating temporary copies of both member types and meta, and then
	// copying back to the original content at the sorted indices.
	auto mbr_types_cpy = type.member_types;
	auto mbr_meta_cpy = meta.members;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		type.member_types[mbr_idx] = mbr_types_cpy[mbr_idxs[mbr_idx]];
		meta.members[mbr_idx] = mbr_meta_cpy[mbr_idxs[mbr_idx]];
	}

	// If we're sorting by Offset, this might affect user code which accesses a buffer block.
	// We will need to redirect member indices from defined index to sorted index using reverse lookup.
	if (sort_aspect == SortAspect::Offset)
	{
		type.member_type_index_redirection.resize(mbr_cnt);
		for (uint32_t map_idx = 0; map_idx < mbr_cnt; map_idx++)
			type.member_type_index_redirection[mbr_idxs[map_idx]] = map_idx;
	}
}